

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

void __thiscall
cppcms::crypto::openssl_aes_encryptor::encrypt
          (openssl_aes_encryptor *this,char *__block,int __edflag)

{
  uchar *userKey;
  uint in_ECX;
  undefined4 in_register_00000014;
  
  check(this);
  if (this->encryption_initialized_ == false) {
    userKey = (uchar *)crypto::key::data(&this->key_);
    AES_set_encrypt_key(userKey,this->type_,(AES_KEY *)&this->key_enc_);
    this->encryption_initialized_ = true;
  }
  AES_cbc_encrypt((uchar *)__block,(uchar *)CONCAT44(in_register_00000014,__edflag),(ulong)in_ECX,
                  (AES_KEY *)&this->key_enc_,this->iv_enc_,1);
  return;
}

Assistant:

virtual void encrypt(void const *in,void *out,unsigned len)
		{
			check();
			if(!encryption_initialized_) {
				AES_set_encrypt_key(reinterpret_cast<unsigned char const *>(key_.data()), type_, &key_enc_);
				encryption_initialized_ = true;
			}
			AES_cbc_encrypt(reinterpret_cast<unsigned char const *>(in),
					reinterpret_cast<unsigned char *>(out), len,
					&key_enc_,
					iv_enc_,
					AES_ENCRYPT);
		}